

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::CheckPropertyCompatibility(cmTarget *this,cmComputeLinkInformation *info,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  ItemVector *pIVar4;
  iterator iVar5;
  ostream *poVar6;
  size_type sVar7;
  pointer pIVar8;
  string prop;
  string result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string propsString;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedMaxNumbers;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedMinNumbers;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedStrings;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedBools;
  string result_1;
  
  pIVar4 = cmComputeLinkInformation::GetItems(info);
  emittedBools._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emittedBools._M_t._M_impl.super__Rb_tree_header._M_header;
  emittedBools._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emittedBools._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emittedBools._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emittedBools._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emittedBools._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
      strBool_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                 ::strBool_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strBool_abi_cxx11_,"COMPATIBLE_INTERFACE_BOOL",(allocator *)&result_1);
      __cxa_atexit(std::__cxx11::string::~string,
                   &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                    ::strBool_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                           ::strBool_abi_cxx11_);
    }
  }
  emittedStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emittedStrings._M_t._M_impl.super__Rb_tree_header._M_header;
  emittedStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emittedStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emittedStrings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emittedStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emittedStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
      strString_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                 ::strString_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strString_abi_cxx11_,"COMPATIBLE_INTERFACE_STRING",(allocator *)&result_1);
      __cxa_atexit(std::__cxx11::string::~string,
                   &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                    ::strString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                           ::strString_abi_cxx11_);
    }
  }
  emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_header;
  emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
      strNumMin_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                 ::strNumMin_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMin_abi_cxx11_,"COMPATIBLE_INTERFACE_NUMBER_MIN",(allocator *)&result_1);
      __cxa_atexit(std::__cxx11::string::~string,
                   &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                    ::strNumMin_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                           ::strNumMin_abi_cxx11_);
    }
  }
  emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_header;
  emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
      strNumMax_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                 ::strNumMax_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMax_abi_cxx11_,"COMPATIBLE_INTERFACE_NUMBER_MAX",(allocator *)&result_1);
      __cxa_atexit(std::__cxx11::string::~string,
                   &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                    ::strNumMax_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                           ::strNumMax_abi_cxx11_);
    }
  }
  for (pIVar8 = (pIVar4->
                super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pIVar8 != (pIVar4->
                super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                )._M_impl.super__Vector_impl_data._M_finish; pIVar8 = pIVar8 + 1) {
    if (pIVar8->Target != (cmTarget *)0x0) {
      checkPropertyConsistency<bool>
                (this,pIVar8->Target,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strBool_abi_cxx11_,&emittedBools,config,BoolType,(bool *)0x0);
      bVar2 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar2) goto LAB_002cac49;
      checkPropertyConsistency<char_const*>
                (this,pIVar8->Target,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strString_abi_cxx11_,&emittedStrings,config,StringType,(char **)0x0);
      bVar2 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar2) goto LAB_002cac49;
      checkPropertyConsistency<char_const*>
                (this,pIVar8->Target,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMin_abi_cxx11_,&emittedMinNumbers,config,NumberMinType,(char **)0x0);
      bVar2 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar2) goto LAB_002cac49;
      checkPropertyConsistency<char_const*>
                (this,pIVar8->Target,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMax_abi_cxx11_,&emittedMaxNumbers,config,NumberMaxType,(char **)0x0);
      bVar2 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar2) goto LAB_002cac49;
    }
  }
  paVar1 = &result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  result._M_dataplus._M_p = (pointer)paVar1;
  intersect(&result_1,&emittedBools,&emittedStrings);
  std::__cxx11::string::operator=((string *)&result,(string *)&result_1);
  std::__cxx11::string::~string((string *)&result_1);
  sVar7 = result._M_string_length;
  if (result._M_string_length == 0) {
    intersect(&result_1,&emittedBools,&emittedMinNumbers);
    std::__cxx11::string::operator=((string *)&result,(string *)&result_1);
    std::__cxx11::string::~string((string *)&result_1);
    sVar7 = result._M_string_length;
    if (result._M_string_length == 0) {
      intersect(&result_1,&emittedBools,&emittedMaxNumbers);
      std::__cxx11::string::operator=((string *)&result,(string *)&result_1);
      std::__cxx11::string::~string((string *)&result_1);
      sVar7 = result._M_string_length;
      if (result._M_string_length == 0) {
        paVar1 = &result_1.field_2;
        result_1._M_string_length = 0;
        result_1.field_2._M_local_buf[0] = '\0';
        result_1._M_dataplus._M_p = (pointer)paVar1;
        intersect(&propsString,&emittedStrings,&emittedMinNumbers);
        std::__cxx11::string::operator=((string *)&result_1,(string *)&propsString);
        std::__cxx11::string::~string((string *)&propsString);
        sVar7 = result_1._M_string_length;
        if (result_1._M_string_length == 0) {
          intersect(&propsString,&emittedStrings,&emittedMaxNumbers);
          std::__cxx11::string::operator=((string *)&result_1,(string *)&propsString);
          std::__cxx11::string::~string((string *)&propsString);
          sVar7 = result_1._M_string_length;
          if (result_1._M_string_length != 0) goto LAB_002cad2d;
          intersect(&prop,&emittedMinNumbers,&emittedMaxNumbers);
        }
        else {
LAB_002cad2d:
          prop._M_dataplus._M_p = (pointer)&prop.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result_1._M_dataplus._M_p == paVar1) {
            prop.field_2._8_8_ = result_1.field_2._8_8_;
          }
          else {
            prop._M_dataplus = result_1._M_dataplus;
          }
          prop.field_2._M_allocated_capacity._1_7_ = result_1.field_2._M_allocated_capacity._1_7_;
          prop.field_2._M_local_buf[0] = result_1.field_2._M_local_buf[0];
          result_1._M_string_length = 0;
          result_1.field_2._M_local_buf[0] = '\0';
          prop._M_string_length = sVar7;
          result_1._M_dataplus._M_p = (pointer)paVar1;
        }
        std::__cxx11::string::~string((string *)&result_1);
        goto LAB_002caa17;
      }
    }
  }
  prop._M_dataplus._M_p = (pointer)&prop.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p == paVar1) {
    prop.field_2._8_8_ = result.field_2._8_8_;
  }
  else {
    prop._M_dataplus = result._M_dataplus;
  }
  prop.field_2._M_allocated_capacity._1_7_ = result.field_2._M_allocated_capacity._1_7_;
  prop.field_2._M_local_buf[0] = result.field_2._M_local_buf[0];
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  prop._M_string_length = sVar7;
  result._M_dataplus._M_p = (pointer)paVar1;
LAB_002caa17:
  std::__cxx11::string::~string((string *)&result);
  if (prop._M_string_length != 0) {
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&emittedBools._M_t,&prop);
    if ((_Rb_tree_header *)iVar5._M_node != &emittedBools._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&props,&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                          ::strBool_abi_cxx11_);
    }
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&emittedStrings._M_t,&prop);
    if ((_Rb_tree_header *)iVar5._M_node != &emittedStrings._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&props,&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                          ::strString_abi_cxx11_);
    }
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&emittedMinNumbers._M_t,&prop);
    if ((_Rb_tree_header *)iVar5._M_node != &emittedMinNumbers._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&props,&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                          ::strNumMin_abi_cxx11_);
    }
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&emittedMaxNumbers._M_t,&prop);
    if ((_Rb_tree_header *)iVar5._M_node != &emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&props,&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                          ::strNumMax_abi_cxx11_);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (props.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               props.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    result_1._M_dataplus._M_p =
         (pointer)props.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    result_1._M_string_length =
         (size_type)
         (props.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + -1);
    cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&propsString,
               (Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&result_1,", ");
    std::operator+(&result_1," and the ",
                   props.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
    std::__cxx11::string::append((string *)&propsString);
    std::__cxx11::string::~string((string *)&result_1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&result_1);
    poVar6 = std::operator<<((ostream *)&result_1,"Property \"");
    poVar6 = std::operator<<(poVar6,(string *)&prop);
    poVar6 = std::operator<<(poVar6,"\" appears in both the ");
    poVar6 = std::operator<<(poVar6,(string *)&propsString);
    poVar6 = std::operator<<(poVar6," property in the dependencies of target \"");
    poVar6 = std::operator<<(poVar6,(string *)&this->Name);
    std::operator<<(poVar6,
                    "\".  This is not allowed. A property may only require compatibility in a boolean interpretation, a numeric minimum, a numeric maximum or a string interpretation, but not a mixture."
                   );
    this_00 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this_00,FATAL_ERROR,&result);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result_1);
    std::__cxx11::string::~string((string *)&propsString);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&props);
  }
  std::__cxx11::string::~string((string *)&prop);
LAB_002cac49:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emittedMaxNumbers._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emittedMinNumbers._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emittedStrings._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emittedBools._M_t);
  return;
}

Assistant:

void cmTarget::CheckPropertyCompatibility(cmComputeLinkInformation *info,
                                          const std::string& config) const
{
  const cmComputeLinkInformation::ItemVector &deps = info->GetItems();

  std::set<std::string> emittedBools;
  static std::string strBool = "COMPATIBLE_INTERFACE_BOOL";
  std::set<std::string> emittedStrings;
  static std::string strString = "COMPATIBLE_INTERFACE_STRING";
  std::set<std::string> emittedMinNumbers;
  static std::string strNumMin = "COMPATIBLE_INTERFACE_NUMBER_MIN";
  std::set<std::string> emittedMaxNumbers;
  static std::string strNumMax = "COMPATIBLE_INTERFACE_NUMBER_MAX";

  for(cmComputeLinkInformation::ItemVector::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    if (!li->Target)
      {
      continue;
      }

    checkPropertyConsistency<bool>(this, li->Target,
                                strBool,
                                emittedBools, config, BoolType, 0);
    if (cmSystemTools::GetErrorOccuredFlag())
      {
      return;
      }
    checkPropertyConsistency<const char *>(this, li->Target,
                                strString,
                                emittedStrings, config,
                                StringType, 0);
    if (cmSystemTools::GetErrorOccuredFlag())
      {
      return;
      }
    checkPropertyConsistency<const char *>(this, li->Target,
                                strNumMin,
                                emittedMinNumbers, config,
                                NumberMinType, 0);
    if (cmSystemTools::GetErrorOccuredFlag())
      {
      return;
      }
    checkPropertyConsistency<const char *>(this, li->Target,
                                strNumMax,
                                emittedMaxNumbers, config,
                                NumberMaxType, 0);
    if (cmSystemTools::GetErrorOccuredFlag())
      {
      return;
      }
    }

  std::string prop = intersect(emittedBools,
                               emittedStrings,
                               emittedMinNumbers,
                               emittedMaxNumbers);

  if (!prop.empty())
    {
    // Use a sorted std::vector to keep the error message sorted.
    std::vector<std::string> props;
    std::set<std::string>::const_iterator i = emittedBools.find(prop);
    if (i != emittedBools.end())
      {
      props.push_back(strBool);
      }
    i = emittedStrings.find(prop);
    if (i != emittedStrings.end())
      {
      props.push_back(strString);
      }
    i = emittedMinNumbers.find(prop);
    if (i != emittedMinNumbers.end())
      {
      props.push_back(strNumMin);
      }
    i = emittedMaxNumbers.find(prop);
    if (i != emittedMaxNumbers.end())
      {
      props.push_back(strNumMax);
      }
    std::sort(props.begin(), props.end());

    std::string propsString = cmJoin(cmRange(props).retreat(1), ", ");
    propsString += " and the " + props.back();

    std::ostringstream e;
    e << "Property \"" << prop << "\" appears in both the "
      << propsString <<
    " property in the dependencies of target \"" << this->GetName() <<
    "\".  This is not allowed. A property may only require compatibility "
    "in a boolean interpretation, a numeric minimum, a numeric maximum or a "
    "string interpretation, but not a mixture.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
}